

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_slice.c
# Opt level: O0

MPP_RET h264e_marking_wr_op(H264eMarkingInfo *info,H264eMmco *op)

{
  int iVar1;
  RK_S32 RVar2;
  H264eMmco *pHVar3;
  H264eMmco *op_local;
  H264eMarkingInfo *info_local;
  
  if (info->wr_cnt < info->size) {
    iVar1 = info->wr_cnt;
    info->wr_cnt = iVar1 + 1;
    pHVar3 = info->ops + iVar1;
    RVar2 = op->difference_of_pic_nums_minus1;
    pHVar3->mmco = op->mmco;
    pHVar3->difference_of_pic_nums_minus1 = RVar2;
    RVar2 = op->long_term_frame_idx;
    pHVar3->long_term_pic_num = op->long_term_pic_num;
    pHVar3->long_term_frame_idx = RVar2;
    pHVar3->max_long_term_frame_idx_plus1 = op->max_long_term_frame_idx_plus1;
    info_local._4_4_ = MPP_OK;
  }
  else {
    _mpp_log_l(2,"h264e_slice","write too many mmco op %d vs %d\n","h264e_marking_wr_op",
               (ulong)(uint)info->wr_cnt,(ulong)(uint)info->size);
    info_local._4_4_ = MPP_NOK;
  }
  return info_local._4_4_;
}

Assistant:

MPP_RET h264e_marking_wr_op(H264eMarkingInfo *info, H264eMmco *op)
{
    if (info->wr_cnt >= info->size) {
        mpp_err_f("write too many mmco op %d vs %d\n",
                  info->wr_cnt, info->size);
        return MPP_NOK;
    }

    info->ops[info->wr_cnt++] = *op;
    return MPP_OK;
}